

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::util::anon_unknown_0::DescriptorPoolTypeResolverTest_TestEnum_Test::
~DescriptorPoolTypeResolverTest_TestEnum_Test(DescriptorPoolTypeResolverTest_TestEnum_Test *this)

{
  DescriptorPoolTypeResolverTest_TestEnum_Test *this_local;
  
  ~DescriptorPoolTypeResolverTest_TestEnum_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(DescriptorPoolTypeResolverTest, TestEnum) {
  Enum type;
  ASSERT_TRUE(
      resolver_
          ->ResolveEnumType(
              GetTypeUrl("proto2_unittest.TestAllTypes.NestedEnum"), &type)
          .ok());
  EnumHasValue(type, "FOO", 1);
  EnumHasValue(type, "BAR", 2);
  EnumHasValue(type, "BAZ", 3);
  EnumHasValue(type, "NEG", -1);
}